

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strencodings.h
# Opt level: O0

long LocaleIndependentAtoi<long>(string_view str)

{
  long lVar1;
  bool bVar2;
  const_reference pvVar3;
  size_type sVar4;
  basic_string_view<char,_std::char_traits<char>_> *this;
  char *in_RSI;
  long in_FS_OFFSET;
  __integer_from_chars_result_type<long> _Var5;
  char *_;
  string_view s;
  long result;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff68;
  size_type in_stack_ffffffffffffff70;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff88;
  size_type in_stack_ffffffffffffff98;
  int __base;
  basic_string_view<char,_std::char_traits<char>_> in_stack_ffffffffffffffa0;
  string_view in_stack_ffffffffffffffb0;
  long local_20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  util::TrimStringView(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa0);
  bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty(in_stack_ffffffffffffff68);
  if ((!bVar2) &&
     (pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70), *pvVar3 == '+')) {
    sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::length(in_stack_ffffffffffffff68)
    ;
    if ((1 < sVar4) &&
       (pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                           (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70), *pvVar3 == '-')) {
      local_20 = 0;
      goto LAB_00188ba7;
    }
    in_stack_ffffffffffffffa0 =
         std::basic_string_view<char,_std::char_traits<char>_>::substr
                   (in_stack_ffffffffffffff88,(size_type)in_stack_ffffffffffffff80,
                    in_stack_ffffffffffffff98);
  }
  __base = (int)(in_stack_ffffffffffffff98 >> 0x20);
  std::basic_string_view<char,_std::char_traits<char>_>::data(in_stack_ffffffffffffff68);
  this = (basic_string_view<char,_std::char_traits<char>_> *)
         std::basic_string_view<char,_std::char_traits<char>_>::data(in_stack_ffffffffffffff68);
  std::basic_string_view<char,_std::char_traits<char>_>::size(in_stack_ffffffffffffff68);
  _Var5 = std::from_chars<long>
                    (in_RSI,in_stack_ffffffffffffffa0._M_str,
                     (long *)in_stack_ffffffffffffffa0._M_len,__base);
  if (_Var5.ec == result_out_of_range) {
    sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::length(in_stack_ffffffffffffff68)
    ;
    if ((sVar4 == 0) ||
       (pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                           (this,in_stack_ffffffffffffff70), *pvVar3 != '-')) {
      local_20 = std::numeric_limits<long>::max();
    }
    else {
      local_20 = std::numeric_limits<long>::min();
    }
  }
  else if (_Var5.ec != 0) {
    local_20 = 0;
  }
LAB_00188ba7:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_20;
}

Assistant:

T LocaleIndependentAtoi(std::string_view str)
{
    static_assert(std::is_integral<T>::value);
    T result;
    // Emulate atoi(...) handling of white space and leading +/-.
    std::string_view s = util::TrimStringView(str);
    if (!s.empty() && s[0] == '+') {
        if (s.length() >= 2 && s[1] == '-') {
            return 0;
        }
        s = s.substr(1);
    }
    auto [_, error_condition] = std::from_chars(s.data(), s.data() + s.size(), result);
    if (error_condition == std::errc::result_out_of_range) {
        if (s.length() >= 1 && s[0] == '-') {
            // Saturate underflow, per strtoll's behavior.
            return std::numeric_limits<T>::min();
        } else {
            // Saturate overflow, per strtoll's behavior.
            return std::numeric_limits<T>::max();
        }
    } else if (error_condition != std::errc{}) {
        return 0;
    }
    return result;
}